

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::handleUserFunctionCall
          (TGlslangToSpvTraverser *this,TIntermAggregate *node)

{
  TStorageQualifier TVar1;
  mapped_type pFVar2;
  TType *pTVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Id IVar8;
  Id IVar9;
  Decoration DVar10;
  Decoration DVar11;
  undefined4 extraout_var;
  char *pcVar12;
  mapped_type *ppFVar13;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_> *this_01;
  size_type sVar14;
  const_reference ppTVar15;
  undefined4 extraout_var_02;
  const_reference pvVar16;
  reference ppTVar17;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  reference pvVar18;
  reference pvVar19;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TQualifier *qualifier;
  undefined4 extraout_var_07;
  bool local_33d;
  bool local_2a5;
  bool local_285;
  AccessChain local_260;
  Id local_204;
  int local_200;
  Id copy_1;
  int a_2;
  Id result;
  Id argCopy;
  Id copy;
  AccessChain local_198;
  Id local_140;
  uint local_13c;
  Id arg;
  int a_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvArgs;
  int local_118;
  int rValueCount;
  int lValueCount;
  value_type local_b8;
  int local_ac;
  undefined1 local_a8 [4];
  int a;
  vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> argTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rValues;
  vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> lValues;
  TQualifierList *qualifiers;
  TIntermSequence *glslangArgs;
  key_type local_48;
  mapped_type local_28;
  Function *function;
  TIntermAggregate *node_local;
  TGlslangToSpvTraverser *this_local;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  function = (Function *)node;
  node_local = (TIntermAggregate *)this;
  iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x35])();
  pcVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    CONCAT44(extraout_var,iVar6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,pcVar12,(allocator<char> *)((long)&glslangArgs + 7));
  ppFVar13 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>_>
             ::operator[](&this->functionMap,&local_48);
  pFVar2 = *ppFVar13;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&glslangArgs + 7));
  if (pFVar2 == (mapped_type)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    local_28 = pFVar2;
    iVar6 = (*function->_vptr_Function[0x33])();
    this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              CONCAT44(extraout_var_00,iVar6);
    iVar6 = (*function->_vptr_Function[0x39])();
    this_01 = (vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
               *)CONCAT44(extraout_var_01,iVar6);
    std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::vector
              ((vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> *)
               &rValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &argTypes.
                super__Vector_base<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::vector
              ((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> *)local_a8);
    for (local_ac = 0; iVar6 = local_ac,
        sVar14 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_00),
        iVar6 < (int)sVar14; local_ac = local_ac + 1) {
      ppTVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (this_00,(long)local_ac);
      iVar6 = (*(*ppTVar15)->_vptr_TIntermNode[3])();
      local_b8 = (value_type)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0xf0))();
      std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::push_back
                ((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> *)local_a8
                 ,&local_b8);
      spv::Builder::clearAccessChain(&this->builder);
      ppTVar15 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                           (this_00,(long)local_ac);
      (*(*ppTVar15)->_vptr_TIntermNode[2])(*ppTVar15,this);
      pvVar16 = std::
                vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                ::operator[](this_01,(long)local_ac);
      TVar1 = *pvVar16;
      ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::
                 operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                             *)local_a8,(long)local_ac);
      pTVar3 = *ppTVar17;
      local_285 = spv::Function::hasImplicitThis(local_28);
      local_285 = local_285 && local_ac == 0;
      bVar5 = originalParam(this,TVar1,pTVar3,local_285);
      if (bVar5) {
LAB_006a403c:
        spv::Builder::getAccessChain((AccessChain *)&lValueCount,&this->builder);
        std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::
        push_back((vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> *)
                  &rValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(value_type *)&lValueCount);
        spv::Builder::AccessChain::~AccessChain((AccessChain *)&lValueCount);
      }
      else {
        pvVar16 = std::
                  vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                  ::operator[](this_01,(long)local_ac);
        bVar5 = writableParam(this,*pvVar16);
        if (bVar5) goto LAB_006a403c;
        ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::
                   back((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> *)
                        local_a8);
        rValueCount = accessChainLoad(this,*ppTVar17);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &argTypes.
                    super__Vector_base<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict *)&rValueCount);
      }
    }
    iVar6 = (**function->_vptr_Function)();
    iVar6 = *(int *)(CONCAT44(extraout_var_03,iVar6) + 0xc);
    iVar7 = (**function->_vptr_Function)();
    pcVar12 = glslang::TSourceLoc::getFilename((TSourceLoc *)CONCAT44(extraout_var_04,iVar7));
    spv::Builder::setDebugSourceLocation(&this->builder,iVar6,pcVar12);
    local_118 = 0;
    spvArgs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&arg);
    for (local_13c = 0; uVar4 = local_13c,
        sVar14 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_00),
        (int)uVar4 < (int)sVar14; local_13c = local_13c + 1) {
      pvVar16 = std::
                vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                ::operator[](this_01,(long)(int)local_13c);
      TVar1 = *pvVar16;
      ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::
                 operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                             *)local_a8,(long)(int)local_13c);
      pTVar3 = *ppTVar17;
      local_2a5 = spv::Function::hasImplicitThis(local_28);
      local_2a5 = local_2a5 && local_13c == 0;
      bVar5 = originalParam(this,TVar1,pTVar3,local_2a5);
      if (bVar5) {
        pvVar18 = std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                  ::operator[]((vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                                *)&rValues.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_118
                              );
        spv::Builder::AccessChain::AccessChain(&local_198,pvVar18);
        spv::Builder::setAccessChain(&this->builder,&local_198);
        spv::Builder::AccessChain::~AccessChain(&local_198);
        local_140 = spv::Builder::accessChainGetLValue(&this->builder);
        local_118 = local_118 + 1;
      }
      else {
        pvVar16 = std::
                  vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                  ::operator[](this_01,(long)(int)local_13c);
        bVar5 = writableParam(this,*pvVar16);
        if (bVar5) {
          DVar10 = spv::Function::getParamPrecision(local_28,local_13c);
          IVar8 = spv::Function::getParamType(local_28,local_13c);
          IVar8 = spv::Builder::getContainedTypeId(&this->builder,IVar8);
          local_140 = spv::Builder::createVariable
                                (&this->builder,DVar10,Function,IVar8,"param",0,true);
          pvVar16 = std::
                    vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                    ::operator[](this_01,(long)(int)local_13c);
          if ((*pvVar16 == EvqIn) ||
             (pvVar16 = std::
                        vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                        ::operator[](this_01,(long)(int)local_13c), *pvVar16 == EvqInOut)) {
            pvVar18 = std::
                      vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                      ::operator[]((vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                                    *)&rValues.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)local_118);
            spv::Builder::AccessChain::AccessChain((AccessChain *)&argCopy,pvVar18);
            spv::Builder::setAccessChain(&this->builder,(AccessChain *)&argCopy);
            spv::Builder::AccessChain::~AccessChain((AccessChain *)&argCopy);
            ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                       ::operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                     *)local_a8,(long)(int)local_13c);
            result = accessChainLoad(this,*ppTVar17);
            spv::Builder::clearAccessChain(&this->builder);
            spv::Builder::setAccessChainLValue(&this->builder,local_140);
            ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                       ::operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                     *)local_a8,(long)(int)local_13c);
            multiTypeStore(this,*ppTVar17,result);
          }
          local_118 = local_118 + 1;
        }
        else {
          IVar8 = spv::Function::getParamType(local_28,local_13c);
          pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &argTypes.
                                super__Vector_base<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)spvArgs.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          IVar9 = spv::Builder::getTypeId(&this->builder,*pvVar19);
          if (IVar8 == IVar9) {
            ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                       ::operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                     *)local_a8,(long)(int)local_13c);
            DVar10 = TranslatePrecisionDecoration(*ppTVar17);
            DVar11 = spv::Function::getParamPrecision(local_28,local_13c);
            if (DVar10 != DVar11) goto LAB_006a44a6;
            pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &argTypes.
                                  super__Vector_base<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)spvArgs.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            local_140 = *pvVar19;
          }
          else {
LAB_006a44a6:
            DVar10 = spv::Function::getParamPrecision(local_28,local_13c);
            IVar8 = spv::Function::getParamType(local_28,local_13c);
            a_2 = spv::Builder::createVariable(&this->builder,DVar10,Function,IVar8,"arg",0,true);
            spv::Builder::clearAccessChain(&this->builder);
            spv::Builder::setAccessChainLValue(&this->builder,a_2);
            ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                       ::operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                     *)local_a8,(long)(int)local_13c);
            pTVar3 = *ppTVar17;
            pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &argTypes.
                                  super__Vector_base<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)spvArgs.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            multiTypeStore(this,pTVar3,*pvVar19);
            iVar6 = a_2;
            DVar10 = spv::Function::getParamPrecision(local_28,local_13c);
            local_140 = spv::Builder::createLoad(&this->builder,iVar6,DVar10,MaskNone,Max,0);
          }
          spvArgs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               spvArgs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&arg,&local_140);
    }
    IVar8 = spv::Builder::createFunctionCall
                      (&this->builder,local_28,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&arg);
    copy_1 = IVar8;
    iVar6 = (*function->_vptr_Function[0x1e])();
    DVar10 = TranslatePrecisionDecoration((TType *)CONCAT44(extraout_var_05,iVar6));
    spv::Builder::setPrecision(&this->builder,IVar8,DVar10);
    IVar8 = copy_1;
    iVar6 = (*function->_vptr_Function[0x1e])();
    qualifier = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x58))();
    DVar10 = TranslateNonUniformDecoration(this,qualifier);
    spv::Builder::addDecoration(&this->builder,IVar8,DVar10,-1);
    local_118 = 0;
    for (local_200 = 0; iVar6 = local_200,
        sVar14 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_00),
        iVar6 < (int)sVar14; local_200 = local_200 + 1) {
      pvVar16 = std::
                vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                ::operator[](this_01,(long)local_200);
      TVar1 = *pvVar16;
      ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::
                 operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                             *)local_a8,(long)local_200);
      pTVar3 = *ppTVar17;
      local_33d = spv::Function::hasImplicitThis(local_28);
      local_33d = local_33d && local_200 == 0;
      bVar5 = originalParam(this,TVar1,pTVar3,local_33d);
      if (bVar5) {
        local_118 = local_118 + 1;
      }
      else {
        pvVar16 = std::
                  vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                  ::operator[](this_01,(long)local_200);
        bVar5 = writableParam(this,*pvVar16);
        if (bVar5) {
          pvVar16 = std::
                    vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                    ::operator[](this_01,(long)local_200);
          if ((*pvVar16 == EvqOut) ||
             (pvVar16 = std::
                        vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                        ::operator[](this_01,(long)local_200), *pvVar16 == EvqInOut)) {
            pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&arg,
                                 (long)local_200);
            IVar8 = spv::Builder::createLoad(&this->builder,*pvVar19,DecorationMax,MaskNone,Max,0);
            local_204 = IVar8;
            ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                       ::operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                     *)local_a8,(long)local_200);
            iVar6 = (*(*ppTVar17)->_vptr_TType[0xb])();
            DVar10 = TranslateNonUniformDecoration
                               (this,(TQualifier *)CONCAT44(extraout_var_07,iVar6));
            spv::Builder::addDecoration(&this->builder,IVar8,DVar10,-1);
            pvVar18 = std::
                      vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                      ::operator[]((vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                                    *)&rValues.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)local_118);
            spv::Builder::AccessChain::AccessChain(&local_260,pvVar18);
            spv::Builder::setAccessChain(&this->builder,&local_260);
            spv::Builder::AccessChain::~AccessChain(&local_260);
            ppTVar17 = std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                       ::operator[]((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>
                                     *)local_a8,(long)local_200);
            multiTypeStore(this,*ppTVar17,local_204);
          }
          local_118 = local_118 + 1;
        }
      }
    }
    this_local._4_4_ = copy_1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&arg);
    std::vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>::~vector
              ((vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> *)local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &argTypes.
                super__Vector_base<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::~vector
              ((vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> *)
               &rValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::handleUserFunctionCall(const glslang::TIntermAggregate* node)
{
    // Grab the function's pointer from the previously created function
    spv::Function* function = functionMap[node->getName().c_str()];
    if (! function)
        return 0;

    const glslang::TIntermSequence& glslangArgs = node->getSequence();
    const glslang::TQualifierList& qualifiers = node->getQualifierList();

    //  See comments in makeFunctions() for details about the semantics for parameter passing.
    //
    // These imply we need a four step process:
    // 1. Evaluate the arguments
    // 2. Allocate and make copies of in, out, and inout arguments
    // 3. Make the call
    // 4. Copy back the results

    // 1. Evaluate the arguments and their types
    std::vector<spv::Builder::AccessChain> lValues;
    std::vector<spv::Id> rValues;
    std::vector<const glslang::TType*> argTypes;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        argTypes.push_back(&glslangArgs[a]->getAsTyped()->getType());
        // build l-value
        builder.clearAccessChain();
        glslangArgs[a]->traverse(this);
        // keep outputs and pass-by-originals as l-values, evaluate others as r-values
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0) ||
            writableParam(qualifiers[a])) {
            // save l-value
            lValues.push_back(builder.getAccessChain());
        } else {
            // process r-value
            rValues.push_back(accessChainLoad(*argTypes.back()));
        }
    }

    // Reset source location to the function call location after argument evaluation
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    // 2. Allocate space for anything needing a copy, and if it's "in" or "inout"
    // copy the original into that space.
    //
    // Also, build up the list of actual arguments to pass in for the call
    int lValueCount = 0;
    int rValueCount = 0;
    std::vector<spv::Id> spvArgs;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        spv::Id arg;
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0)) {
            builder.setAccessChain(lValues[lValueCount]);
            arg = builder.accessChainGetLValue();
            ++lValueCount;
        } else if (writableParam(qualifiers[a])) {
            // need space to hold the copy
            arg = builder.createVariable(function->getParamPrecision(a), spv::StorageClassFunction,
                builder.getContainedTypeId(function->getParamType(a)), "param");
            if (qualifiers[a] == glslang::EvqIn || qualifiers[a] == glslang::EvqInOut) {
                // need to copy the input into output space
                builder.setAccessChain(lValues[lValueCount]);
                spv::Id copy = accessChainLoad(*argTypes[a]);
                builder.clearAccessChain();
                builder.setAccessChainLValue(arg);
                multiTypeStore(*argTypes[a], copy);
            }
            ++lValueCount;
        } else {
            // process r-value, which involves a copy for a type mismatch
            if (function->getParamType(a) != builder.getTypeId(rValues[rValueCount]) ||
                TranslatePrecisionDecoration(*argTypes[a]) != function->getParamPrecision(a))
            {
                spv::Id argCopy = builder.createVariable(function->getParamPrecision(a), spv::StorageClassFunction, function->getParamType(a), "arg");
                builder.clearAccessChain();
                builder.setAccessChainLValue(argCopy);
                multiTypeStore(*argTypes[a], rValues[rValueCount]);
                arg = builder.createLoad(argCopy, function->getParamPrecision(a));
            } else
                arg = rValues[rValueCount];
            ++rValueCount;
        }
        spvArgs.push_back(arg);
    }

    // 3. Make the call.
    spv::Id result = builder.createFunctionCall(function, spvArgs);
    builder.setPrecision(result, TranslatePrecisionDecoration(node->getType()));
    builder.addDecoration(result, TranslateNonUniformDecoration(node->getType().getQualifier()));

    // 4. Copy back out an "out" arguments.
    lValueCount = 0;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0))
            ++lValueCount;
        else if (writableParam(qualifiers[a])) {
            if (qualifiers[a] == glslang::EvqOut || qualifiers[a] == glslang::EvqInOut) {
                spv::Id copy = builder.createLoad(spvArgs[a], spv::NoPrecision);
                builder.addDecoration(copy, TranslateNonUniformDecoration(argTypes[a]->getQualifier()));
                builder.setAccessChain(lValues[lValueCount]);
                multiTypeStore(*argTypes[a], copy);
            }
            ++lValueCount;
        }
    }

    return result;
}